

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void wr_stores(void)

{
  object *obj;
  store_conflict *psVar1;
  uint8_t v;
  object **ppoVar2;
  ulong uVar3;
  
  wr_u16b(z_info->store_max);
  for (uVar3 = 0; psVar1 = stores, uVar3 < z_info->store_max; uVar3 = uVar3 + 1) {
    if (stores[uVar3].owner == (owner *)0x0) {
      v = '\0';
    }
    else {
      v = (uint8_t)(stores[uVar3].owner)->oidx;
    }
    wr_byte(v);
    wr_byte(psVar1[uVar3].stock_num);
    ppoVar2 = &psVar1[uVar3].stock;
    while (obj = *ppoVar2, obj != (object *)0x0) {
      wr_item(obj->known);
      wr_item(obj);
      ppoVar2 = &obj->next;
    }
  }
  return;
}

Assistant:

void wr_stores(void)
{
	int i;

	wr_u16b(z_info->store_max);
	for (i = 0; i < z_info->store_max; i++) {
		const struct store *store = &stores[i];
		struct object *obj;

		/* Save the current owner */
		wr_byte((store->owner) ? store->owner->oidx : 0);

		/* Save the stock size */
		wr_byte(store->stock_num);

		/* Save the stock */
		for (obj = store->stock; obj; obj = obj->next) {
			wr_item(obj->known);
			wr_item(obj);
		}
	}
}